

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

void __thiscall CLI::ValidationError::~ValidationError(ValidationError *this)

{
  ValidationError *this_local;
  
  ~ValidationError(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

explicit ValidationError(std::string name, std::string msg) : ValidationError(name + ": " + msg) {}